

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O2

void __thiscall
PathTracerViewer::create_descriptors(PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  allocator_type local_79;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  VkSampler immutable_samplers [1];
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_78._24_8_ = (element_type *)0x100000001;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_78 + 0x18);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_78,__l,
             (allocator_type *)immutable_samplers);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)local_48,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_78);
  std::__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_pool).
              super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            ((_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_78);
  immutable_samplers[0] =
       ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_sampler;
  local_48 = (undefined1  [8])0x100000000;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1000000001;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_48;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)immutable_samplers;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_78,__l_00,&local_79);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)(local_78 + 0x18),device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_78);
  std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)
             (local_78 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::_Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
  ~_Vector_base((_Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                 *)local_78);
  myvk::DescriptorSet::Create
            ((DescriptorSet *)local_78,&this->m_descriptor_pool,&this->m_descriptor_set_layout);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return;
}

Assistant:

void PathTracerViewer::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1}});
	{
		VkDescriptorSetLayoutBinding binding = {};
		binding.binding = 0;
		binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		binding.descriptorCount = 1;
		binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};
		binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {binding});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}